

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_udp.c
# Opt level: O0

int csp_if_udp_rx_work(int sockfd,size_t unused,csp_iface_t *iface)

{
  csp_packet_t *packet_00;
  ssize_t sVar1;
  void *in_RSI;
  int in_EDI;
  int received_len;
  int header_size;
  csp_packet_t *packet;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  packet_00 = csp_buffer_get(0x114a5b);
  if (packet_00 == (csp_packet_t *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar2 = csp_id_setup_rx((csp_packet_t *)
                            CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    sVar1 = recvfrom(in_EDI,packet_00->frame_begin,(long)iVar2 + 0x100,0x100,(sockaddr *)0x0,
                     (socklen_t *)0x0);
    if ((int)sVar1 < iVar2) {
      csp_buffer_free(packet_00);
      iVar2 = -1;
    }
    else {
      packet_00->frame_length = (uint16_t)sVar1;
      iVar2 = csp_id_strip((csp_packet_t *)CONCAT44(iVar2,(int)sVar1));
      if (iVar2 == 0) {
        csp_qfifo_write(_received_len,(csp_iface_t *)CONCAT44(in_stack_fffffffffffffffc,in_EDI),
                        in_RSI);
        iVar2 = 0;
      }
      else {
        csp_buffer_free(packet_00);
        iVar2 = -2;
      }
    }
  }
  return iVar2;
}

Assistant:

int csp_if_udp_rx_work(int sockfd, size_t unused, csp_iface_t * iface) {

	csp_packet_t * packet = csp_buffer_get(0);
	if (packet == NULL) {
		return CSP_ERR_NOMEM;
	}

	/* Setup RX frane to point to ID */
	int header_size = csp_id_setup_rx(packet);
	int received_len = recvfrom(sockfd, (char *)packet->frame_begin, sizeof(packet->data) + header_size, MSG_WAITALL, NULL, NULL);
	
	if (received_len < header_size) {
		csp_buffer_free(packet);
		return CSP_ERR_NOMEM;
	}

	packet->frame_length = received_len;

	/* Parse the frame and strip the ID field */
	if (csp_id_strip(packet) != 0) {
		csp_buffer_free(packet);
		return CSP_ERR_INVAL;
	}

	csp_qfifo_write(packet, iface, NULL);

	return CSP_ERR_NONE;
}